

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external_signer.cpp
# Opt level: O1

void RegisterSignerRPCCommands(CRPCTable *t)

{
  long lVar1;
  string category;
  int iVar2;
  long in_FS_OFFSET;
  undefined1 *puVar3;
  undefined8 in_stack_ffffffffffffffd0;
  long in_stack_ffffffffffffffd8;
  undefined8 in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (RegisterSignerRPCCommands(CRPCTable&)::commands == '\0') {
    iVar2 = __cxa_guard_acquire(&RegisterSignerRPCCommands(CRPCTable&)::commands);
    if (iVar2 != 0) {
      puVar3 = &stack0xffffffffffffffd8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&stack0xffffffffffffffc8,"signer","");
      category._M_string_length = in_stack_ffffffffffffffd0;
      category._M_dataplus._M_p = puVar3;
      category.field_2._M_allocated_capacity = in_stack_ffffffffffffffd8;
      category.field_2._8_8_ = in_stack_ffffffffffffffe0;
      CRPCCommand::CRPCCommand
                (RegisterSignerRPCCommands::commands,category,
                 (RpcMethodFnType)&stack0xffffffffffffffc8);
      if (puVar3 != &stack0xffffffffffffffd8) {
        operator_delete(puVar3,in_stack_ffffffffffffffd8 + 1);
      }
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&RegisterSignerRPCCommands(CRPCTable&)::commands);
    }
  }
  CRPCTable::appendCommand
            (t,&RegisterSignerRPCCommands::commands[0].name,RegisterSignerRPCCommands::commands);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void RegisterSignerRPCCommands(CRPCTable& t)
{
    static const CRPCCommand commands[]{
        {"signer", &enumeratesigners},
    };
    for (const auto& c : commands) {
        t.appendCommand(c.name, &c);
    }
}